

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<26UL> * __thiscall
mserialize::cx_strcat<8ul,6ul,2ul,8ul,1ul,1ul>
          (cx_string<26UL> *__return_storage_ptr__,mserialize *this,cx_string<8UL> *strings,
          cx_string<6UL> *strings_1,cx_string<2UL> *strings_2,cx_string<8UL> *strings_3,
          cx_string<1UL> *strings_4,cx_string<1UL> *strings_5)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong auStack_a8 [8];
  long lStack_68;
  mserialize *local_60;
  cx_string<8UL> *local_58;
  cx_string<6UL> *local_50;
  cx_string<2UL> *local_48;
  cx_string<8UL> *local_40;
  cx_string<1UL> *local_38;
  char buffer [27];
  
  pcVar1 = buffer;
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  local_60 = this;
  local_58 = strings;
  local_50 = strings_1;
  local_48 = strings_2;
  local_40 = strings_3;
  local_38 = strings_4;
  auStack_a8[1] = 8;
  auStack_a8[2] = 6;
  auStack_a8[3] = 2;
  auStack_a8[4] = 8;
  auStack_a8[5] = 1;
  auStack_a8[6] = 1;
  for (lVar2 = 1; lVar2 != 7; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_a8[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = *(char *)((&lStack_68)[lVar2] + uVar3);
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<26UL>::cx_string(__return_storage_ptr__,buffer);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}